

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_function.cpp
# Opt level: O2

optional_ptr<duckdb::EncodingFunction,_true> __thiscall
duckdb::DBConfig::GetEncodeFunction(DBConfig *this,string *name)

{
  pthread_mutex_t *__mutex;
  pointer pEVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
  *this_00;
  
  this_00 = &this->encoding_functions;
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
            ::operator->(this_00);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  pEVar1 = unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
           ::operator->(this_00);
  iVar2 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(pEVar1->functions)._M_h,name);
  unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>::
  operator->(this_00);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar3 = (mapped_type *)0x0;
  }
  else {
    pEVar1 = unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>
             ::operator->(this_00);
    pmVar3 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::EncodingFunction>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pEVar1->functions,name);
  }
  pthread_mutex_unlock(__mutex);
  return (optional_ptr<duckdb::EncodingFunction,_true>)pmVar3;
}

Assistant:

optional_ptr<EncodingFunction> DBConfig::GetEncodeFunction(const string &name) const {
	lock_guard<mutex> l(encoding_functions->lock);
	// Check if the function is already loaded into the global compression functions.
	if (encoding_functions->functions.find(name) != encoding_functions->functions.end()) {
		return &encoding_functions->functions[name];
	}
	return nullptr;
}